

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

posix_thread * __thiscall oqpi::posix_thread::operator=(posix_thread *this,posix_thread *rhs)

{
  bool bVar1;
  posix_thread *rhs_local;
  posix_thread *this_local;
  
  if ((this != rhs) &&
     ((this->handle_ == 0 ||
      (bVar1 = assert_and_return_false
                         ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                          ,0x41,"handle_ == 0",""), bVar1)))) {
    this->handle_ = rhs->handle_;
    rhs->handle_ = 0;
  }
  return this;
}

Assistant:

posix_thread& operator =(posix_thread &&rhs)
        {
            if (this != &rhs && oqpi_ensure(handle_ == 0))
            {
                handle_     = rhs.handle_;
                rhs.handle_ = 0;
            }
            return (*this);
        }